

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsDataCollectionCompare(FmsDataCollection lhs,FmsDataCollection rhs)

{
  FmsInt FVar1;
  FmsFieldDescriptor *ppFVar2;
  FmsFieldDescriptor *ppFVar3;
  FmsField *ppFVar4;
  FmsField *ppFVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  FmsInt FVar10;
  FmsInt FVar11;
  
  if (lhs != rhs) {
    if (lhs == (FmsDataCollection)0x0) {
      uVar8 = 0xffffffff;
    }
    else if (rhs == (FmsDataCollection)0x0) {
      uVar8 = 0xfffffffe;
    }
    else {
      iVar6 = strcmp(lhs->name,rhs->name);
      iVar7 = FmsMeshCompare(lhs->mesh,rhs->mesh);
      uVar9 = (iVar6 != 0) + 10;
      if (iVar7 == 0) {
        uVar9 = (uint)(iVar6 != 0);
      }
      FVar1 = lhs->num_fds;
      FVar11 = rhs->num_fds;
      if (FVar1 == FVar11) {
        if (FVar1 != 0) {
          ppFVar2 = lhs->fds;
          ppFVar3 = rhs->fds;
          FVar10 = 0;
          do {
            iVar6 = FmsFieldDescriptorCompare(ppFVar2[FVar10],ppFVar3[FVar10]);
            uVar8 = uVar9 + 100;
            if (iVar6 == 0) {
              uVar8 = uVar9;
            }
            uVar9 = uVar8;
            FVar10 = FVar10 + 1;
          } while (FVar1 != FVar10);
        }
      }
      else {
        uVar9 = uVar9 | 100;
      }
      if (FVar1 == FVar11) {
        if (FVar1 != 0) {
          ppFVar4 = lhs->fields;
          ppFVar5 = rhs->fields;
          FVar11 = 0;
          do {
            iVar6 = FmsFieldCompare(ppFVar4[FVar11],ppFVar5[FVar11]);
            uVar8 = uVar9 + 1000;
            if (iVar6 == 0) {
              uVar8 = uVar9;
            }
            uVar9 = uVar8;
            FVar11 = FVar11 + 1;
          } while (FVar1 != FVar11);
        }
      }
      else {
        uVar9 = uVar9 + 1000;
      }
      iVar6 = FmsMetaDataCompare(lhs->mdata,rhs->mdata);
      uVar8 = uVar9 + 10000;
      if (iVar6 == 0) {
        uVar8 = uVar9;
      }
    }
    return uVar8;
  }
  return 0;
}

Assistant:

int FmsDataCollectionCompare(FmsDataCollection lhs, FmsDataCollection rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  // Compare names
  int diff = 0;
  const char *lhs_name = NULL;
  const char *rhs_name = NULL;
  FmsDataCollectionGetName(lhs, &lhs_name);
  FmsDataCollectionGetName(rhs, &rhs_name);
  if(strcmp(lhs_name, rhs_name)) {
    diff += 1;
  }

  // Compare mesh topologies
  FmsMesh lhs_mesh = NULL, rhs_mesh = NULL;
  FmsDataCollectionGetMesh(lhs, &lhs_mesh);
  FmsDataCollectionGetMesh(rhs, &rhs_mesh);
  if(FmsMeshCompare(lhs_mesh, rhs_mesh)) {
    diff += 10;
  }

  // Compare FieldDescriptors
  FmsFieldDescriptor *lhs_fds = NULL, *rhs_fds = NULL;
  FmsInt lhs_nfds = 0, rhs_nfds = -1;
  FmsDataCollectionGetFieldDescriptors(lhs, &lhs_fds, &lhs_nfds);
  FmsDataCollectionGetFieldDescriptors(rhs, &rhs_fds, &rhs_nfds);
  if(lhs_nfds != rhs_nfds) {
    diff += 100;
  } else {
    for(FmsInt i = 0; i < lhs_nfds; i++) {
      if(FmsFieldDescriptorCompare(lhs_fds[i], rhs_fds[i])) {
        diff += 100;
      }
    }
  }

  // Compare Fields
  FmsField *lhs_fields = NULL, *rhs_fields = NULL;
  FmsInt lhs_nfields = 0, rhs_nfields = -1;
  FmsDataCollectionGetFields(lhs, &lhs_fields, &lhs_nfields);
  FmsDataCollectionGetFields(rhs, &rhs_fields, &rhs_nfields);
  if(lhs_nfds != rhs_nfds) {
    diff += 1000;
  } else {
    for(FmsInt i = 0; i < lhs_nfds; i++) {
      if(FmsFieldCompare(lhs_fields[i], rhs_fields[i])) {
        diff += 1000;
      }
    }
  }

  // Compare MetaData
  FmsMetaData lhs_md = NULL, rhs_md = NULL;
  FmsDataCollectionGetMetaData(lhs, &lhs_md);
  FmsDataCollectionGetMetaData(rhs, &rhs_md);
  if(FmsMetaDataCompare(lhs_md, rhs_md)) {
    diff += 10000;
  }
  return diff;
}